

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void floatstr(Context *ctx,char *buf,size_t bufsize,float f,int leavedecimal)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *ptr;
  char *end;
  size_t len;
  int leavedecimal_local;
  float f_local;
  size_t bufsize_local;
  char *buf_local;
  Context *ctx_local;
  
  sVar2 = MOJOSHADER_printFloat(buf,bufsize,f);
  if (sVar2 + 2 < bufsize) {
    pcVar3 = strchr(buf,0x2e);
    ptr = buf + sVar2;
    if (pcVar3 == (char *)0x0) {
      if (leavedecimal != 0) {
        strcat(buf,".0");
      }
    }
    else {
      do {
        pcVar4 = ptr + -1;
        pcVar1 = pcVar4;
        if (pcVar4 == pcVar3) break;
        pcVar1 = ptr;
        ptr = pcVar4;
      } while (*pcVar4 == '0');
      ptr = pcVar1;
      if ((leavedecimal != 0) && (ptr == pcVar3)) {
        ptr = ptr + 2;
      }
      *ptr = '\0';
    }
  }
  else {
    fail(ctx,"BUG: internal buffer is too small");
  }
  return;
}

Assistant:

static void floatstr(Context *ctx, char *buf, size_t bufsize, float f,
                     int leavedecimal)
{
    const size_t len = MOJOSHADER_printFloat(buf, bufsize, f);
    if ((len+2) >= bufsize)
        fail(ctx, "BUG: internal buffer is too small");
    else
    {
        char *end = buf + len;
        char *ptr = strchr(buf, '.');
        if (ptr == NULL)
        {
            if (leavedecimal)
                strcat(buf, ".0");
            return;  // done.
        } // if

        while (--end != ptr)
        {
            if (*end != '0')
            {
                end++;
                break;
            } // if
        } // while
        if ((leavedecimal) && (end == ptr))
            end += 2;
        *end = '\0';  // chop extra '0' or all decimal places off.
    } // else
}